

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.cpp
# Opt level: O0

shared_ptr<SL::WS_LITE::IWSListener_Configuration> __thiscall
SL::WS_LITE::HubContext_Configuration::CreateListener
          (HubContext_Configuration *this,PortNumber port,NetworkProtocol protocol,
          ExtensionOptions options)

{
  ExtensionOptions EVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined3 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_00000032;
  tuple<asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  tVar6;
  ExtensionOptions in_R8B;
  shared_ptr<SL::WS_LITE::IWSListener_Configuration> sVar7;
  shared_ptr<SL::WS_LITE::HubContext> local_d8;
  __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_c8;
  shared_ptr<SL::WS_LITE::ThreadContext> *t;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
  *__range2;
  undefined1 local_88 [40];
  tcp local_60;
  basic_endpoint<asio::ip::tcp> local_5c;
  undefined1 local_40 [27];
  ExtensionOptions local_25;
  int local_24;
  ExtensionOptions options_local;
  _Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false> _Stack_20;
  NetworkProtocol protocol_local;
  HubContext_Configuration *this_local;
  HubContext_Configuration *pHStack_10;
  PortNumber port_local;
  
  tVar6.
  super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl._2_6_ =
       in_register_00000032;
  tVar6.
  super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl._0_2_ =
       port.value;
  local_24 = CONCAT31(in_register_00000009,options);
  this_local._6_2_ = (unsigned_short)protocol;
  local_25 = in_R8B;
  _Stack_20._M_head_impl =
       (basic_socket_acceptor<asio::ip::tcp> *)
       tVar6.
       super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
       .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl;
  pHStack_10 = this;
  if (local_24 == 0) {
    std::__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)((long)tVar6.
                         super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                         .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>
                         ._M_head_impl + 8));
    HubContext::getnextContext((HubContext *)local_40);
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    local_60 = asio::ip::tcp::v4();
    asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint(&local_5c,&local_60,this_local._6_2_);
    std::
    make_unique<asio::basic_socket_acceptor<asio::ip::tcp>,asio::io_context&,asio::ip::basic_endpoint<asio::ip::tcp>>
              ((io_context *)(local_40 + 0x10),(basic_endpoint<asio::ip::tcp> *)&peVar3->io_service)
    ;
    peVar4 = std::
             __shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)((long)tVar6.
                                    super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                                    .
                                    super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>
                                    ._M_head_impl + 8));
    std::
    unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
    ::operator=(&peVar4->acceptor,
                (unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                 *)(local_40 + 0x10));
    std::
    unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
    ::~unique_ptr((unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                   *)(local_40 + 0x10));
    std::shared_ptr<SL::WS_LITE::ThreadContext>::~shared_ptr
              ((shared_ptr<SL::WS_LITE::ThreadContext> *)local_40);
  }
  else {
    std::__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)((long)tVar6.
                         super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                         .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>
                         ._M_head_impl + 8));
    HubContext::getnextContext((HubContext *)local_88);
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
    __range2._0_4_ = asio::ip::tcp::v6();
    asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<asio::ip::tcp> *)((long)&__range2 + 4),(tcp *)&__range2,
               this_local._6_2_);
    std::
    make_unique<asio::basic_socket_acceptor<asio::ip::tcp>,asio::io_context&,asio::ip::basic_endpoint<asio::ip::tcp>>
              ((io_context *)(local_88 + 0x10),(basic_endpoint<asio::ip::tcp> *)&peVar3->io_service)
    ;
    peVar4 = std::
             __shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)((long)tVar6.
                                    super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                                    .
                                    super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>
                                    ._M_head_impl + 8));
    std::
    unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
    ::operator=(&peVar4->acceptor,
                (unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                 *)(local_88 + 0x10));
    std::
    unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
    ::~unique_ptr((unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                   *)(local_88 + 0x10));
    std::shared_ptr<SL::WS_LITE::ThreadContext>::~shared_ptr
              ((shared_ptr<SL::WS_LITE::ThreadContext> *)local_88);
  }
  peVar4 = std::
           __shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)((long)tVar6.
                                super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                                .
                                super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>
                                ._M_head_impl + 8));
  __end2 = std::
           vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
           ::begin(&peVar4->ThreadContexts);
  t = (shared_ptr<SL::WS_LITE::ThreadContext> *)
      std::
      vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
      ::end(&peVar4->ThreadContexts);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
                                *)&t);
    if (!bVar2) break;
    local_c8 = (__shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
                  ::operator*(&__end2);
    EVar1 = local_25;
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_c8);
    peVar5 = std::
             __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->WebSocketContext_);
    peVar5->ExtensionOptions_ = EVar1;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
    ::operator++(&__end2);
  }
  std::make_shared<SL::WS_LITE::WSListener_Configuration,std::shared_ptr<SL::WS_LITE::HubContext>&>
            (&local_d8);
  std::shared_ptr<SL::WS_LITE::IWSListener_Configuration>::
  shared_ptr<SL::WS_LITE::WSListener_Configuration,void>
            ((shared_ptr<SL::WS_LITE::IWSListener_Configuration> *)this,
             (shared_ptr<SL::WS_LITE::WSListener_Configuration> *)&local_d8);
  std::shared_ptr<SL::WS_LITE::WSListener_Configuration>::~shared_ptr
            ((shared_ptr<SL::WS_LITE::WSListener_Configuration> *)&local_d8);
  sVar7.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar7.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<SL::WS_LITE::IWSListener_Configuration>)
         sVar7.
         super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<IWSListener_Configuration> CreateListener(PortNumber port, NetworkProtocol protocol,
                                                                          ExtensionOptions options) override
        {
            if (protocol == NetworkProtocol::IPV4) {
                HubContext_->acceptor = std::make_unique<asio::ip::tcp::acceptor>(HubContext_->getnextContext()->io_service,
                                                                                  asio::ip::tcp::endpoint(asio::ip::tcp::v4(), port.value));
            }
            else {
                HubContext_->acceptor = std::make_unique<asio::ip::tcp::acceptor>(HubContext_->getnextContext()->io_service,
                                                                                  asio::ip::tcp::endpoint(asio::ip::tcp::v6(), port.value));
            }
            for (auto &t : HubContext_->ThreadContexts) {
                t->WebSocketContext_->ExtensionOptions_ = options;
            }
            return std::make_shared<WSListener_Configuration>(HubContext_);
        }